

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_slot_allocator_alloc(ma_slot_allocator *pAllocator,ma_uint64 *pSlot)

{
  uint uVar1;
  ma_result mVar2;
  int iVar3;
  ma_uint32 mVar4;
  int iVar5;
  ma_uint32 iGroup;
  ulong uVar6;
  ma_uint32 i;
  uint uVar7;
  bool bVar8;
  
  if (pSlot == (ma_uint64 *)0x0 || pAllocator == (ma_slot_allocator *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    mVar2 = MA_OUT_OF_MEMORY;
    for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
      iVar5 = 0;
      for (uVar6 = 0; uVar1 = pAllocator->capacity,
          uVar6 < ((uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0); uVar6 = uVar6 + 1) {
        while (uVar1 = pAllocator->pGroups[uVar6].bitfield, uVar1 != 0xffffffff) {
          for (uVar7 = 0; (uVar7 != 0x20 && ((uVar1 >> (uVar7 & 0x1f) & 1) != 0)); uVar7 = uVar7 + 1
              ) {
          }
          LOCK();
          bVar8 = uVar1 == pAllocator->pGroups[uVar6].bitfield;
          if (bVar8) {
            pAllocator->pGroups[uVar6].bitfield = uVar1 | 1 << (uVar7 & 0x1f);
          }
          UNLOCK();
          if (bVar8) {
            LOCK();
            pAllocator->count = pAllocator->count + 1;
            UNLOCK();
            uVar7 = uVar7 - iVar5;
            if (pAllocator->capacity <= uVar7) {
              return MA_OUT_OF_MEMORY;
            }
            mVar4 = pAllocator->pSlots[uVar7] + 1;
            pAllocator->pSlots[uVar7] = mVar4;
            *pSlot = CONCAT44(mVar4,uVar7);
            return MA_SUCCESS;
          }
        }
        iVar5 = iVar5 + -0x20;
      }
      if (uVar1 <= pAllocator->count) {
        return MA_OUT_OF_MEMORY;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_slot_allocator_alloc(ma_slot_allocator* pAllocator, ma_uint64* pSlot)
{
    ma_uint32 iAttempt;
    const ma_uint32 maxAttempts = 2;    /* The number of iterations to perform until returning MA_OUT_OF_MEMORY if no slots can be found. */

    if (pAllocator == NULL || pSlot == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iAttempt = 0; iAttempt < maxAttempts; iAttempt += 1) {
        /* We need to acquire a suitable bitfield first. This is a bitfield that's got an available slot within it. */
        ma_uint32 iGroup;
        for (iGroup = 0; iGroup < ma_slot_allocator_group_capacity(pAllocator); iGroup += 1) {
            /* CAS */
            for (;;) {
                ma_uint32 oldBitfield;
                ma_uint32 newBitfield;
                ma_uint32 bitOffset;

                oldBitfield = ma_atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */

                /* Fast check to see if anything is available. */
                if (oldBitfield == 0xFFFFFFFF) {
                    break;  /* No available bits in this bitfield. */
                }

                bitOffset = ma_ffs_32(~oldBitfield);
                MA_ASSERT(bitOffset < 32);

                newBitfield = oldBitfield | (1 << bitOffset);

                if (ma_atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
                    ma_uint32 slotIndex;

                    /* Increment the counter as soon as possible to have other threads report out-of-memory sooner than later. */
                    ma_atomic_fetch_add_32(&pAllocator->count, 1);

                    /* The slot index is required for constructing the output value. */
                    slotIndex = (iGroup << 5) + bitOffset;  /* iGroup << 5 = iGroup * 32 */
                    if (slotIndex >= pAllocator->capacity) {
                        return MA_OUT_OF_MEMORY;
                    }

                    /* Increment the reference count before constructing the output value. */
                    pAllocator->pSlots[slotIndex] += 1;

                    /* Construct the output value. */
                    *pSlot = (((ma_uint64)pAllocator->pSlots[slotIndex] << 32) | slotIndex);

                    return MA_SUCCESS;
                }
            }
        }

        /* We weren't able to find a slot. If it's because we've reached our capacity we need to return MA_OUT_OF_MEMORY. Otherwise we need to do another iteration and try again. */
        if (pAllocator->count < pAllocator->capacity) {
            ma_yield();
        } else {
            return MA_OUT_OF_MEMORY;
        }
    }

    /* We couldn't find a slot within the maximum number of attempts. */
    return MA_OUT_OF_MEMORY;
}